

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O2

Request<capnp::AnyPointer,_capnp::AnyPointer> * __thiscall
capnp::MembraneHook::newCall
          (Request<capnp::AnyPointer,_capnp::AnyPointer> *__return_storage_ptr__,MembraneHook *this,
          uint64_t interfaceId,uint16_t methodId,Maybe<capnp::MessageSize> *sizeHint,CallHints hints
          )

{
  ClientHook *pCVar1;
  MembranePolicy *pMVar2;
  RequestHook *pRVar3;
  Builder builder_00;
  bool bVar4;
  undefined8 uVar5;
  MembraneRequestHook *pMVar6;
  RequestHook *pRVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  CappedArray<char,_17UL> *params_2;
  undefined6 in_register_0000008a;
  uint uVar11;
  bool local_21d;
  uint local_21c;
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> _p425;
  CappedArray<char,_17UL> local_208;
  Fault local_1e8;
  Own<capnp::(anonymous_namespace)::MembraneRequestHook,_std::nullptr_t> newHook;
  Builder builder;
  Maybe<capnp::Capability::Client> redirect;
  undefined1 local_180 [24];
  Own<capnp::RequestHook,_std::nullptr_t> local_168;
  Own<capnp::RequestHook,_std::nullptr_t> innerHook;
  Own<capnp::ClientHook,_std::nullptr_t> local_148;
  Own<capnp::ClientHook,_std::nullptr_t> local_138;
  Own<capnp::ClientHook,_std::nullptr_t> local_128;
  CappedArray<char,_17UL> local_118;
  String argValues [1];
  CappedArray<char,_17UL> local_e0;
  undefined4 local_c0;
  undefined4 uStack_bc;
  uint uStack_b8;
  undefined4 uStack_b4;
  char local_b0 [8];
  undefined4 local_a8;
  undefined4 uStack_a4;
  uint uStack_a0;
  undefined4 uStack_9c;
  char local_98 [8];
  uint64_t local_90;
  undefined8 uStack_88;
  PointerBuilder local_80;
  PointerBuilder local_68;
  Array<char> local_48;
  
  uVar10 = CONCAT62(in_register_0000008a,hints) & 0xffffffff;
  pCVar1 = (this->resolved).ptr.ptr;
  if (pCVar1 != (ClientHook *)0x0) {
    local_98[0] = (sizeHint->ptr).isSet;
    if ((bool)local_98[0] == true) {
      local_90 = (sizeHint->ptr).field_1.value.wordCount;
      uStack_88 = *(undefined8 *)((long)&(sizeHint->ptr).field_1 + 8);
    }
    (**pCVar1->_vptr_ClientHook)
              (__return_storage_ptr__,pCVar1,interfaceId,(ulong)methodId,local_98,uVar10);
    return __return_storage_ptr__;
  }
  pMVar2 = (this->policy).ptr;
  uVar11 = (uint)methodId;
  if (this->reverse == true) {
    local_21c = (uint)CONCAT62(in_register_0000008a,hints);
    (*((this->inner).ptr)->_vptr_ClientHook[4])(&_p425);
    uVar5 = _p425._0_8_;
    local_128.disposer._0_1_ = _p425.isSet;
    local_128.disposer._1_3_ = _p425._1_3_;
    local_128.disposer._4_4_ = _p425._4_4_;
    local_128.ptr._0_4_ = _p425.field_1._0_4_;
    local_128.ptr._4_4_ = _p425.field_1._4_4_;
    _p425.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
          )0x0;
    _p425._0_8_ = uVar5;
    (*pMVar2->_vptr_MembranePolicy[1])(&redirect,pMVar2,interfaceId,(ulong)uVar11);
    kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&local_128);
    kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
              ((Own<capnp::ClientHook,_std::nullptr_t> *)&_p425);
    uVar10 = (ulong)local_21c;
  }
  else {
    (*((this->inner).ptr)->_vptr_ClientHook[4])(&_p425);
    uVar5 = _p425._0_8_;
    local_138.disposer._0_1_ = _p425.isSet;
    local_138.disposer._1_3_ = _p425._1_3_;
    local_138.disposer._4_4_ = _p425._4_4_;
    local_138.ptr._0_4_ = _p425.field_1._0_4_;
    local_138.ptr._4_4_ = _p425.field_1._4_4_;
    _p425.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
          )0x0;
    _p425._0_8_ = uVar5;
    (**pMVar2->_vptr_MembranePolicy)(&redirect,pMVar2,interfaceId,(ulong)uVar11);
    kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&local_138);
    kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
              ((Own<capnp::ClientHook,_std::nullptr_t> *)&_p425);
  }
  uVar9 = (uint)uVar10;
  if (redirect.ptr.isSet == true) {
    iVar8 = (*((this->policy).ptr)->_vptr_MembranePolicy[4])();
    if ((char)iVar8 != '\0') {
      whenMoreResolved((MembraneHook *)local_180);
      _p425.isSet = (bool)local_180[0];
      if (local_180[0] == (capnp)0x1) {
        _p425.field_1 =
             (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
              )local_180._8_8_;
        local_180._8_8_ =
             (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
              )0x0;
      }
      kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::
      ~NullableValue((NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *)
                     local_180);
      bVar4 = _p425.isSet;
      local_21c = uVar9;
      if (_p425.isSet == true) {
        addRef((MembraneHook *)&newHook);
        kj::Promise<kj::Own<capnp::ClientHook,decltype(nullptr)>>::
        attach<kj::Own<capnp::ClientHook,decltype(nullptr)>>
                  ((Promise<kj::Own<capnp::ClientHook,decltype(nullptr)>> *)&local_118,
                   (Own<capnp::ClientHook,_std::nullptr_t> *)&_p425.field_1.value);
        newLocalPromiseClient
                  ((capnp *)local_180,
                   (Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)&local_118);
        local_b0[0] = (sizeHint->ptr).isSet;
        if ((bool)local_b0[0] == true) {
          local_a8 = *(undefined4 *)&(sizeHint->ptr).field_1;
          uStack_a4 = *(undefined4 *)((long)&(sizeHint->ptr).field_1 + 4);
          uStack_a0 = (sizeHint->ptr).field_1.value.capCount;
          uStack_9c = *(undefined4 *)((long)&(sizeHint->ptr).field_1 + 0xc);
        }
        (*(code *)**(undefined8 **)local_180._8_8_)
                  (__return_storage_ptr__,local_180._8_8_,interfaceId,uVar11,local_b0,local_21c);
        kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
                  ((Own<capnp::ClientHook,_std::nullptr_t> *)local_180);
        kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                  ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_118);
        kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
                  ((Own<capnp::ClientHook,_std::nullptr_t> *)&newHook);
      }
      kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::
      ~NullableValue(&_p425);
      uVar9 = local_21c;
      if (bVar4 != false) goto LAB_002afceb;
    }
    _p425.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
          )redirect.ptr.field_1.value.hook.ptr;
    local_148.disposer = redirect.ptr.field_1.value.hook.disposer;
    redirect.ptr.field_1.value.hook.ptr = (ClientHook *)0x0;
    _p425._0_8_ = redirect.ptr.field_1.value.hook.disposer;
    local_148.ptr = (ClientHook *)0x0;
    local_e0.content[0x10] = (sizeHint->ptr).isSet;
    if ((bool)local_e0.content[0x10] == true) {
      local_c0 = *(undefined4 *)&(sizeHint->ptr).field_1;
      uStack_bc = *(undefined4 *)((long)&(sizeHint->ptr).field_1 + 4);
      uStack_b8 = (sizeHint->ptr).field_1.value.capCount;
      uStack_b4 = *(undefined4 *)((long)&(sizeHint->ptr).field_1 + 0xc);
    }
    (**((ClientHook *)_p425.field_1)->_vptr_ClientHook)
              (__return_storage_ptr__,_p425.field_1,interfaceId,(ulong)methodId,
               local_e0.content + 0x10,(ulong)uVar9);
    kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
              ((Own<capnp::ClientHook,_std::nullptr_t> *)&_p425);
    kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&local_148);
  }
  else {
    pCVar1 = (this->inner).ptr;
    local_e0.currentSize._0_1_ = (sizeHint->ptr).isSet;
    if ((bool)(char)local_e0.currentSize == true) {
      local_e0.content._0_4_ = *(undefined4 *)&(sizeHint->ptr).field_1;
      local_e0.content._4_4_ = *(undefined4 *)((long)&(sizeHint->ptr).field_1 + 4);
      local_e0.content._8_4_ = (sizeHint->ptr).field_1.value.capCount;
      local_e0.content._12_4_ = *(undefined4 *)((long)&(sizeHint->ptr).field_1 + 0xc);
    }
    params_2 = &local_e0;
    (**pCVar1->_vptr_ClientHook)(local_180,pCVar1,interfaceId,(ulong)uVar11,params_2,uVar10);
    pRVar7 = local_168.ptr;
    uVar5 = local_180._8_8_;
    pMVar2 = (this->policy).ptr;
    local_21d = this->reverse;
    builder.builder.segment = (SegmentBuilder *)CONCAT44(local_180._4_4_,local_180._0_4_);
    innerHook.disposer = local_168.disposer;
    local_168.ptr = (RequestHook *)0x0;
    innerHook.ptr = pRVar7;
    if ((((undefined1 *)pRVar7->brand == &(anonymous_namespace)::DUMMY) &&
        ((MembranePolicy *)pRVar7[2].brand == pMVar2)) &&
       ((bool)*(char *)&pRVar7[3]._vptr_RequestHook != local_21d)) {
      local_68.pointer = (WirePointer *)local_180._16_8_;
      local_68.capTable = (CapTableBuilder *)local_180._8_8_;
      _p425._0_8_ = capnp::_::PointerBuilder::getCapTable(&local_68);
      _p425.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
            )&pRVar7[3].brand;
      local_208.currentSize = 0x4224f8;
      local_208.content[0] = '\x05';
      local_208.content[1] = '\0';
      local_208.content[2] = '\0';
      local_208.content[3] = '\0';
      local_208.content[4] = '\0';
      local_208.content[5] = '\0';
      local_208.content[6] = '\0';
      local_208.content[7] = '\0';
      local_208.content[8] =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
            )_p425._0_8_ == _p425.field_1;
      if (!(bool)local_208.content[8]) {
        local_1e8.exception = (Exception *)0x0;
        kj::toCharSequence<capnp::_::CapTableBuilder*&>
                  ((CappedArray<char,_17UL> *)&newHook,(kj *)&_p425,(CapTableBuilder **)" == ");
        kj::_::Stringifier::operator*(&local_118,(Stringifier *)&kj::_::STR,(void *)_p425.field_1);
        kj::_::concat<kj::CappedArray<char,17ul>,kj::StringPtr&,kj::CappedArray<char,17ul>>
                  ((String *)&local_48,(_ *)&newHook,&local_208,(StringPtr *)&local_118,params_2);
        argValues[0].content.ptr = local_48.ptr;
        argValues[0].content.size_ = local_48.size_;
        argValues[0].content.disposer = local_48.disposer;
        local_48.ptr = (char *)0x0;
        local_48.size_ = 0;
        kj::Array<char>::~Array(&local_48);
        newHook.ptr = (MembraneRequestHook *)0x1;
        newHook.disposer = (Disposer *)argValues;
        kj::_::Debug::Fault::init
                  (&local_1e8,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane.c++"
                  );
        kj::Array<char>::~Array(&argValues[0].content);
        kj::_::Debug::Fault::fatal(&local_1e8);
      }
      capnp::_::PointerBuilder::imbue
                (&local_80,&local_68,(CapTableBuilder *)pRVar7[4]._vptr_RequestHook);
      (__return_storage_ptr__->super_Builder).builder.pointer = local_80.pointer;
      (__return_storage_ptr__->super_Builder).builder.segment = local_80.segment;
      (__return_storage_ptr__->super_Builder).builder.capTable = local_80.capTable;
      pRVar3 = (RequestHook *)pRVar7[1].brand;
      (__return_storage_ptr__->hook).disposer = (Disposer *)pRVar7[1]._vptr_RequestHook;
      (__return_storage_ptr__->hook).ptr = pRVar3;
      pRVar7[1].brand = (void *)0x0;
    }
    else {
      (*pMVar2->_vptr_MembranePolicy[2])(&_p425);
      kj::
      heap<capnp::(anonymous_namespace)::MembraneRequestHook,kj::Own<capnp::RequestHook,decltype(nullptr)>,kj::Own<capnp::MembranePolicy,decltype(nullptr)>,bool&>
                ((kj *)&newHook,&innerHook,(Own<capnp::MembranePolicy,_std::nullptr_t> *)&_p425,
                 &local_21d);
      kj::Own<capnp::MembranePolicy,_std::nullptr_t>::dispose
                ((Own<capnp::MembranePolicy,_std::nullptr_t> *)&_p425);
      pMVar6 = newHook.ptr;
      builder_00.builder.capTable = (CapTableBuilder *)uVar5;
      builder_00.builder.segment = builder.builder.segment;
      builder_00.builder.pointer = (WirePointer *)local_180._16_8_;
      anon_unknown_0::MembraneCapTableBuilder::imbue
                ((Builder *)&_p425,&(newHook.ptr)->capTable,builder_00);
      (__return_storage_ptr__->super_Builder).builder.pointer = (WirePointer *)local_208.currentSize
      ;
      (__return_storage_ptr__->super_Builder).builder.segment = (SegmentBuilder *)_p425._0_8_;
      (__return_storage_ptr__->super_Builder).builder.capTable = (CapTableBuilder *)_p425.field_1;
      _p425._0_8_ = newHook.disposer;
      newHook.ptr = (MembraneRequestHook *)0x0;
      (__return_storage_ptr__->hook).disposer = newHook.disposer;
      (__return_storage_ptr__->hook).ptr = &pMVar6->super_RequestHook;
      _p425.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
            )0x0;
      kj::Own<capnp::RequestHook,_std::nullptr_t>::dispose
                ((Own<capnp::RequestHook,_std::nullptr_t> *)&_p425);
      kj::Own<capnp::(anonymous_namespace)::MembraneRequestHook,_std::nullptr_t>::~Own(&newHook);
    }
    kj::Own<capnp::RequestHook,_std::nullptr_t>::dispose(&innerHook);
    kj::Own<capnp::RequestHook,_std::nullptr_t>::dispose(&local_168);
  }
LAB_002afceb:
  kj::_::NullableValue<capnp::Capability::Client>::~NullableValue(&redirect.ptr);
  return __return_storage_ptr__;
}

Assistant:

Request<AnyPointer, AnyPointer> newCall(
      uint64_t interfaceId, uint16_t methodId, kj::Maybe<MessageSize> sizeHint,
      CallHints hints) override {
    KJ_IF_SOME(r, resolved) {
      return r->newCall(interfaceId, methodId, sizeHint, hints);
    }

    auto redirect = reverse
        ? policy->outboundCall(interfaceId, methodId, Capability::Client(inner->addRef()))
        : policy->inboundCall(interfaceId, methodId, Capability::Client(inner->addRef()));
    KJ_IF_SOME(r, redirect) {
      if (policy->shouldResolveBeforeRedirecting()) {
        // The policy says that *if* this capability points into the membrane, then we want to
        // redirect the call. However, if this capability is a promise, then it could resolve to
        // something outside the membrane later. We have to wait before we actually redirect,
        // otherwise behavior will differ depending on whether the promise is resolved.
        KJ_IF_SOME(p, whenMoreResolved()) {
          return newLocalPromiseClient(p.attach(addRef()))
              ->newCall(interfaceId, methodId, sizeHint, hints);
        }
      }

      return ClientHook::from(kj::mv(r))->newCall(interfaceId, methodId, sizeHint, hints);
    } else {
      // For pass-through calls, we don't worry about promises, because if the capability resolves
      // to something outside the membrane, then the call will pass back out of the membrane too.
      return MembraneRequestHook::wrap(
          inner->newCall(interfaceId, methodId, sizeHint, hints), *policy, reverse);
    }